

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ifDsd.c
# Opt level: O3

int If_DsdManCheckInv_rec(If_DsdMan_t *p,int iLit)

{
  void *pvVar1;
  int iVar2;
  uint uVar3;
  ulong uVar4;
  
  if (-1 < iLit) {
    do {
      if ((p->vObjs).nSize <= (int)((uint)iLit >> 1)) {
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecPtr.h"
                      ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
      }
      pvVar1 = (p->vObjs).pArray[(uint)iLit >> 1];
      uVar3 = *(uint *)((long)pvVar1 + 4) & 7;
      if (uVar3 != 5) {
        switch(uVar3) {
        case 2:
          goto switchD_00424950_caseD_3;
        case 3:
        case 6:
          goto switchD_00424950_caseD_3;
        case 4:
          if (0x7ffffff < *(uint *)((long)pvVar1 + 4)) {
            uVar4 = 0;
            do {
              iVar2 = *(int *)((long)pvVar1 + uVar4 * 4 + 8);
              if (iVar2 == 0) {
                return 0;
              }
              iVar2 = If_DsdManCheckInv_rec(p,iVar2);
              if (iVar2 != 0) {
switchD_00424950_caseD_3:
                return 1;
              }
              uVar4 = uVar4 + 1;
            } while (uVar4 < *(uint *)((long)pvVar1 + 4) >> 0x1b);
          }
switchD_00424950_caseD_3:
          return 0;
        default:
          __assert_fail("0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/map/if/ifDsd.c"
                        ,0x5b7,"int If_DsdManCheckInv_rec(If_DsdMan_t *, int)");
        }
      }
      iVar2 = If_DsdManCheckInv_rec(p,*(int *)((long)pvVar1 + 0xc));
      if (iVar2 == 0) {
        return 0;
      }
      iLit = *(uint *)((long)pvVar1 + 0x10);
    } while (-1 < iLit);
  }
  __assert_fail("Lit >= 0",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/util/abc_global.h"
                ,0x12f,"int Abc_Lit2Var(int)");
}

Assistant:

int If_DsdManCheckInv_rec( If_DsdMan_t * p, int iLit )
{
    If_DsdObj_t * pObj;
    int i, iFanin;
    pObj = If_DsdVecObj( &p->vObjs, Abc_Lit2Var(iLit) );
    if ( If_DsdObjType(pObj) == IF_DSD_VAR )
        return 1;
    if ( If_DsdObjType(pObj) == IF_DSD_AND || If_DsdObjType(pObj) == IF_DSD_PRIME )
        return 0;
    if ( If_DsdObjType(pObj) == IF_DSD_XOR )
    {
        If_DsdObjForEachFaninLit( &p->vObjs, pObj, iFanin, i )
            if ( If_DsdManCheckInv_rec(p, iFanin) )
                return 1;
        return 0;
    }
    if ( If_DsdObjType(pObj) == IF_DSD_MUX )
        return If_DsdManCheckInv_rec(p, pObj->pFans[1]) && If_DsdManCheckInv_rec(p, pObj->pFans[2]);
    assert( 0 );
    return 0;
}